

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O0

int Abc_NtkRenodeEvalBdd(If_Man_t *p,If_Cut_t *pCut)

{
  DdManager *dd;
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint *pTruth;
  DdNode *n;
  DdNode *n_00;
  int nNodes;
  int k;
  int i;
  DdNode *bFuncNew;
  DdNode *bFunc;
  int pOrder [32];
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pcVar3 = If_CutPerm(pCut);
  nNodes = 0;
  while( true ) {
    iVar2 = If_CutLeaveNum(pCut);
    dd = s_pDd;
    if (iVar2 <= nNodes) break;
    pOrder[(long)nNodes + -2] = -100;
    pcVar3[nNodes] = -100;
    nNodes = nNodes + 1;
  }
  pTruth = If_CutTruth(p,pCut);
  iVar2 = If_CutLeaveNum(pCut);
  n = Kit_TruthToBdd(dd,pTruth,iVar2,0);
  Cudd_Ref(n);
  n_00 = Extra_Reorder(s_pReo,s_pDd,n,(int *)&bFunc);
  Cudd_Ref(n_00);
  cVar1 = '\0';
  nNodes = 0;
  while( true ) {
    iVar2 = If_CutLeaveNum(pCut);
    if (iVar2 <= nNodes) break;
    if (-1 < pOrder[(long)nNodes + -2]) {
      cVar1 = cVar1 + '\x01';
      pcVar3[pOrder[(long)nNodes + -2]] = cVar1;
    }
    nNodes = nNodes + 1;
  }
  iVar2 = Cudd_DagSize(n_00);
  Cudd_RecursiveDeref(s_pDd,n_00);
  Cudd_RecursiveDeref(s_pDd,n);
  return iVar2 + -1;
}

Assistant:

int Abc_NtkRenodeEvalBdd( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int pOrder[IF_MAX_LUTSIZE];
    DdNode * bFunc, * bFuncNew;
    int i, k, nNodes;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = pOrder[i] = -100;
    bFunc = Kit_TruthToBdd( s_pDd, If_CutTruth(p, pCut), If_CutLeaveNum(pCut), 0 );  Cudd_Ref( bFunc );
    bFuncNew = Extra_Reorder( s_pReo, s_pDd, bFunc, pOrder );                     Cudd_Ref( bFuncNew );
    for ( i = k = 0; i < If_CutLeaveNum(pCut); i++ )
        if ( pOrder[i] >= 0 )
            pPerm[pOrder[i]] = ++k; // double-check this!
    nNodes = -1 + Cudd_DagSize( bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFunc );
    return nNodes; 
}